

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_group_get_scroll(nk_context *ctx,char *id,nk_uint *x_offset,nk_uint *y_offset)

{
  nk_window *win_00;
  int len;
  nk_hash name;
  nk_context *ctx_00;
  nk_uint *pnVar1;
  nk_uint *in_RCX;
  nk_uint *in_RDX;
  char *in_RSI;
  long in_RDI;
  nk_uint *y_offset_ptr;
  nk_uint *x_offset_ptr;
  nk_window *win;
  nk_hash id_hash;
  int id_len;
  nk_uint in_stack_ffffffffffffffb8;
  nk_hash in_stack_ffffffffffffffbc;
  nk_window *in_stack_ffffffffffffffc0;
  
  if ((((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) &&
      (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) != 0)) && (in_RSI != (char *)0x0)) {
    win_00 = *(nk_window **)(in_RDI + 0x40d8);
    len = nk_strlen(in_RSI);
    name = nk_murmur_hash(in_RSI,len,2);
    ctx_00 = (nk_context *)nk_find_value(win_00,name);
    if (ctx_00 == (nk_context *)0x0) {
      ctx_00 = (nk_context *)
               nk_add_value((nk_context *)0x0,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                            in_stack_ffffffffffffffb8);
      pnVar1 = nk_add_value(ctx_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                            in_stack_ffffffffffffffb8);
      if (ctx_00 == (nk_context *)0x0) {
        return;
      }
      if (pnVar1 == (nk_uint *)0x0) {
        return;
      }
      *pnVar1 = 0;
      (ctx_00->input).keyboard.keys[0].down = 0;
    }
    else {
      pnVar1 = nk_find_value(win_00,name + 1);
    }
    if (in_RDX != (nk_uint *)0x0) {
      *in_RDX = (ctx_00->input).keyboard.keys[0].down;
    }
    if (in_RCX != (nk_uint *)0x0) {
      *in_RCX = *pnVar1;
    }
  }
  return;
}

Assistant:

NK_API void
nk_group_get_scroll(struct nk_context *ctx, const char *id, nk_uint *x_offset, nk_uint *y_offset)
{
int id_len;
nk_hash id_hash;
struct nk_window *win;
nk_uint *x_offset_ptr;
nk_uint *y_offset_ptr;

NK_ASSERT(ctx);
NK_ASSERT(id);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout || !id)
return;

/* find persistent group scrollbar value */
win = ctx->current;
id_len = (int)nk_strlen(id);
id_hash = nk_murmur_hash(id, (int)id_len, NK_PANEL_GROUP);
x_offset_ptr = nk_find_value(win, id_hash);
if (!x_offset_ptr) {
x_offset_ptr = nk_add_value(ctx, win, id_hash, 0);
y_offset_ptr = nk_add_value(ctx, win, id_hash+1, 0);

NK_ASSERT(x_offset_ptr);
NK_ASSERT(y_offset_ptr);
if (!x_offset_ptr || !y_offset_ptr) return;
*x_offset_ptr = *y_offset_ptr = 0;
} else y_offset_ptr = nk_find_value(win, id_hash+1);
if (x_offset)
*x_offset = *x_offset_ptr;
if (y_offset)
*y_offset = *y_offset_ptr;
}